

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O3

stringpiece_ssize_type __thiscall
google::protobuf::StringPiece::find_first_not_of(StringPiece *this,StringPiece s,size_type pos)

{
  ulong uVar1;
  stringpiece_ssize_type sVar2;
  long lVar3;
  stringpiece_ssize_type i_1;
  stringpiece_ssize_type i;
  long lVar4;
  stringpiece_ssize_type length;
  char *data;
  bool lookup [256];
  char acStack_138 [264];
  
  lVar3 = s.length_;
  uVar1 = this->length_;
  sVar2 = -1;
  if (0 < (long)uVar1) {
    if (lVar3 < 1) {
      sVar2 = 0;
    }
    else if (lVar3 == 1) {
      if (pos < uVar1) {
        do {
          if (this->ptr_[pos] != *s.ptr_) {
            return pos;
          }
          pos = pos + 1;
        } while (uVar1 != pos);
      }
    }
    else {
      lVar4 = 0;
      memset(acStack_138,0,0x100);
      do {
        acStack_138[(byte)s.ptr_[lVar4]] = '\x01';
        lVar4 = lVar4 + 1;
      } while (lVar3 != lVar4);
      sVar2 = -1;
      if ((long)pos < (long)uVar1) {
        do {
          if (acStack_138[(byte)this->ptr_[pos]] != '\x01') {
            return pos;
          }
          pos = pos + 1;
        } while (uVar1 != pos);
      }
    }
  }
  return sVar2;
}

Assistant:

stringpiece_ssize_type StringPiece::find_first_not_of(StringPiece s,
                                                      size_type pos) const {
  if (length_ <= 0) return npos;
  if (s.length_ <= 0) return 0;
  // Avoid the cost of BuildLookupTable() for a single-character search.
  if (s.length_ == 1) return find_first_not_of(s.ptr_[0], pos);

  bool lookup[UCHAR_MAX + 1] = { false };
  BuildLookupTable(s, lookup);
  for (stringpiece_ssize_type i = pos; i < length_; ++i) {
    if (!lookup[static_cast<unsigned char>(ptr_[i])]) {
      return i;
    }
  }
  return npos;
}